

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodecTests.cc
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> * avro::parsing::randomBytes(size_t len)

{
  ulong in_RSI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  size_t i;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *result;
  value_type_conflict2 *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  result_type_conflict in_stack_ffffffffffffffb4;
  undefined8 local_30;
  size_type in_stack_ffffffffffffffd8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffffe0;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x238795);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  for (local_30 = 0; local_30 < in_RSI; local_30 = local_30 + 1) {
    in_stack_ffffffffffffffb4 =
         boost::random::
         mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>
         ::operator()((mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>
                       *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
               in_stack_ffffffffffffffa8);
  }
  return in_RDI;
}

Assistant:

static vector<uint8_t> randomBytes(size_t len)
{
    vector<uint8_t> result;
    result.reserve(len);
    for (size_t i = 0; i < len; ++i) {
        result.push_back(rnd());
    }
    return result;
}